

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O0

void * internal_memalign(mstate m,size_t alignment,size_t bytes)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  mchunkptr p_00;
  long *local_98;
  ulong local_90;
  mchunkptr remainder;
  size_t remainder_size;
  size_t size;
  size_t newsize;
  size_t leadsize;
  mchunkptr newp;
  char *pos;
  char *br;
  mchunkptr p;
  size_t req;
  size_t nb;
  size_t a;
  void *mem;
  size_t bytes_local;
  size_t alignment_local;
  mstate m_local;
  
  a = 0;
  bytes_local = alignment;
  if (alignment < 0x20) {
    bytes_local = 0x20;
  }
  if ((bytes_local & bytes_local - 1) != 0) {
    for (nb = 0x20; nb < bytes_local; nb = nb << 1) {
    }
    bytes_local = nb;
  }
  if (bytes < -bytes_local - 0x80) {
    if (bytes < 0x17) {
      local_90 = 0x20;
    }
    else {
      local_90 = bytes + 0x17 & 0xfffffffffffffff0;
    }
    a = (size_t)dlmalloc(local_90 + bytes_local + 0x18);
    if ((void *)a != (void *)0x0) {
      br = (char *)(a + -0x10);
      if ((a & bytes_local - 1) != 0) {
        local_98 = (long *)((a + (bytes_local - 1) & -bytes_local) - 0x10);
        if ((ulong)((long)local_98 - (long)br) < 0x20) {
          local_98 = (long *)((long)local_98 + bytes_local);
        }
        uVar2 = (long)local_98 - (long)br;
        uVar3 = (*(ulong *)(a + -8) & 0xfffffffffffffff8) - uVar2;
        if ((*(ulong *)(a + -8) & 3) == 0) {
          *local_98 = ((mchunkptr)br)->prev_foot + uVar2;
          local_98[1] = uVar3;
        }
        else {
          local_98[1] = local_98[1] & 1U | uVar3 | 2;
          *(ulong *)((long)local_98 + uVar3 + 8) = *(ulong *)((long)local_98 + uVar3 + 8) | 1;
          *(ulong *)(a + -8) = *(ulong *)(a + -8) & 1 | uVar2 | 2;
          *(ulong *)(a + (uVar2 - 8)) = *(ulong *)(a + (uVar2 - 8)) | 1;
          dispose_chunk(m,(mchunkptr)br,uVar2);
        }
        br = (char *)local_98;
      }
      if (((*(ulong *)(br + 8) & 3) != 0) &&
         (local_90 + 0x20 < (*(ulong *)(br + 8) & 0xfffffffffffffff8))) {
        uVar2 = (*(ulong *)(br + 8) & 0xfffffffffffffff8) - local_90;
        p_00 = (mchunkptr)(br + local_90);
        *(ulong *)(br + 8) = *(ulong *)(br + 8) & 1 | local_90 | 2;
        *(ulong *)(br + local_90 + 8) = *(ulong *)(br + local_90 + 8) | 1;
        p_00->head = p_00->head & 1 | uVar2 | 2;
        *(ulong *)((long)p_00 + uVar2 + 8) = *(ulong *)((long)p_00 + uVar2 + 8) | 1;
        dispose_chunk(m,p_00,uVar2);
      }
      a = (size_t)(br + 0x10);
    }
  }
  else if (m != (mstate)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  return (void *)a;
}

Assistant:

static void* internal_memalign(mstate m, size_t alignment, size_t bytes) {
  void* mem = 0;
  if (alignment <  MIN_CHUNK_SIZE) /* must be at least a minimum chunk size */
    alignment = MIN_CHUNK_SIZE;
  if ((alignment & (alignment-SIZE_T_ONE)) != 0) {/* Ensure a power of 2 */
    size_t a = MALLOC_ALIGNMENT << 1;
    while (a < alignment) a <<= 1;
    alignment = a;
  }
  if (bytes >= MAX_REQUEST - alignment) {
    if (m != 0)  { /* Test isn't needed but avoids compiler warning */
      MALLOC_FAILURE_ACTION;
    }
  }
  else {
    size_t nb = request2size(bytes);
    size_t req = nb + alignment + MIN_CHUNK_SIZE - CHUNK_OVERHEAD;
    mem = internal_malloc(m, req);
    if (mem != 0) {
      mchunkptr p = mem2chunk(mem);
      if (PREACTION(m))
        return 0;
      if ((((size_t)(mem)) & (alignment - 1)) != 0) { /* misaligned */
        /*
          Find an aligned spot inside chunk.  Since we need to give
          back leading space in a chunk of at least MIN_CHUNK_SIZE, if
          the first calculation places us at a spot with less than
          MIN_CHUNK_SIZE leader, we can move to the next aligned spot.
          We've allocated enough total room so that this is always
          possible.
        */
        char* br = (char*)mem2chunk((size_t)(((size_t)((char*)mem + alignment -
                                                       SIZE_T_ONE)) &
                                             -alignment));
        char* pos = ((size_t)(br - (char*)(p)) >= MIN_CHUNK_SIZE)?
          br : br+alignment;
        mchunkptr newp = (mchunkptr)pos;
        size_t leadsize = pos - (char*)(p);
        size_t newsize = chunksize(p) - leadsize;

        if (is_mmapped(p)) { /* For mmapped chunks, just adjust offset */
          newp->prev_foot = p->prev_foot + leadsize;
          newp->head = newsize;
        }
        else { /* Otherwise, give back leader, use the rest */
          set_inuse(m, newp, newsize);
          set_inuse(m, p, leadsize);
          dispose_chunk(m, p, leadsize);
        }
        p = newp;
      }

      /* Give back spare room at the end */
      if (!is_mmapped(p)) {
        size_t size = chunksize(p);
        if (size > nb + MIN_CHUNK_SIZE) {
          size_t remainder_size = size - nb;
          mchunkptr remainder = chunk_plus_offset(p, nb);
          set_inuse(m, p, nb);
          set_inuse(m, remainder, remainder_size);
          dispose_chunk(m, remainder, remainder_size);
        }
      }

      mem = chunk2mem(p);
      assert (chunksize(p) >= nb);
      assert(((size_t)mem & (alignment - 1)) == 0);
      check_inuse_chunk(m, p);
      POSTACTION(m);
    }
  }
  return mem;
}